

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O0

istreambuf_iterator<char,_std::char_traits<char>_> *
date::skip_spaces<std::istreambuf_iterator<char,std::char_traits<char>>>
          (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
          istreambuf_iterator<char,_std::char_traits<char>_> *end)

{
  bool bVar1;
  undefined1 local_30 [8];
  static_string<char,_7UL> spaces;
  char_type ch;
  istreambuf_iterator<char,_std::char_traits<char>_> *end_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *pos_local;
  
  while( true ) {
    bVar1 = std::operator!=(pos,end);
    if (!bVar1) {
      return pos;
    }
    spaces.m_length._7_1_ = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator*(pos);
    local_30 = (undefined1  [8])0xd0c0b0a0920;
    spaces.m_data._M_elems[0] = '\x06';
    spaces.m_data._M_elems[1] = '\0';
    spaces.m_data._M_elems[2] = '\0';
    spaces.m_data._M_elems[3] = '\0';
    spaces.m_data._M_elems[4] = '\0';
    spaces.m_data._M_elems[5] = '\0';
    spaces.m_data._M_elems[6] = '\0';
    spaces._7_1_ = 0;
    bVar1 = static_string<char,_7UL>::contains
                      ((static_string<char,_7UL> *)local_30,spaces.m_length._7_1_);
    if (!bVar1) break;
    std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(pos);
  }
  return pos;
}

Assistant:

Iterator& skip_spaces(Iterator& pos, const Iterator& end)
{
    using char_type = typename iterator_traits<Iterator>::value_type;
    for (; pos != end; ++pos)
    {
        const char_type ch = *pos;
        constexpr auto spaces = make_static_string<char_type>(" \t\n\v\f\r");
        if (!spaces.contains(ch))
            break;
    }
    return pos;
}